

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O2

string * EncodeJSONString(string *__return_storage_ptr__,string *in)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pbVar2 = (byte *)(in->_M_dataplus)._M_p;
  pbVar3 = pbVar2;
  do {
    if (pbVar3 == pbVar2 + in->_M_string_length) {
      return __return_storage_ptr__;
    }
    bVar1 = *pbVar3;
    if (((byte)(bVar1 - 8) < 6) && ((0x37U >> ((byte)(bVar1 - 8) & 0x1f) & 1) != 0)) {
LAB_00116395:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (bVar1 < 0x20) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else if ((bVar1 == 0x5c) || (bVar1 == 0x22)) goto LAB_00116395;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pbVar3 = pbVar3 + 1;
    pbVar2 = (byte *)(in->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

std::string EncodeJSONString(const std::string& in) {
  static const char* hex_digits = "0123456789abcdef";
  std::string out;
  out.reserve(in.length() * 1.2);
  for (std::string::const_iterator it = in.begin(); it != in.end(); ++it) {
    char c = *it;
    if (c == '\b')
      out += "\\b";
    else if (c == '\f')
      out += "\\f";
    else if (c == '\n')
      out += "\\n";
    else if (c == '\r')
      out += "\\r";
    else if (c == '\t')
      out += "\\t";
    else if (0x0 <= c && c < 0x20) {
      out += "\\u00";
      out += hex_digits[c >> 4];
      out += hex_digits[c & 0xf];
    } else if (c == '\\')
      out += "\\\\";
    else if (c == '\"')
      out += "\\\"";
    else
      out += c;
  }
  return out;
}